

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

void __thiscall
Jupiter::IRC::Client::setPrimaryConfigSection(Client *this,Config *in_primary_section)

{
  string *__str;
  Config *in_primary_section_local;
  Client *this_local;
  
  this->m_primary_section = in_primary_section;
  if (this->m_primary_section == (Config *)0x0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              (&this->m_primary_section_name);
  }
  else {
    __str = Config::getName_abi_cxx11_(this->m_primary_section);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->m_primary_section_name,__str);
  }
  return;
}

Assistant:

void Jupiter::IRC::Client::setPrimaryConfigSection(Jupiter::Config *in_primary_section) {
	m_primary_section = in_primary_section;

	if (m_primary_section != nullptr)
		m_primary_section_name = m_primary_section->getName();
	else
		m_primary_section_name.clear();
}